

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

mat4 * __thiscall Camera::getViewMatrix(mat4 *__return_storage_ptr__,Camera *this)

{
  tvec3<float,(glm::precision)0> *this_00;
  tvec3<float,_(glm::precision)0> *in_R8;
  double dVar1;
  double dVar2;
  double b;
  double dVar3;
  double dVar4;
  tvec3<float,_(glm::precision)0> tVar5;
  undefined8 local_a0;
  float local_98;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_90;
  undefined1 local_84 [8];
  vec3 pos;
  float local_70;
  undefined1 local_68 [8];
  vec3 up;
  float local_50;
  float local_44;
  undefined8 local_40;
  float local_38;
  undefined8 local_30;
  vec3 right;
  vec3 direction;
  float halfPI;
  Camera *this_local;
  
  dVar1 = cos((double)(this->rotation).field_0.field_0.x);
  dVar2 = sin((double)((this->rotation).field_0.field_0.y + 3.1415927));
  b = sin((double)(this->rotation).field_0.field_0.x);
  dVar3 = cos((double)(this->rotation).field_0.field_0.x);
  dVar4 = cos((double)((this->rotation).field_0.field_0.y + 3.1415927));
  this_00 = (tvec3<float,(glm::precision)0> *)((long)&right.field_0 + 8);
  glm::tvec3<float,(glm::precision)0>::tvec3<double,double,double>
            (this_00,dVar1 * dVar2,b,dVar3 * dVar4);
  dVar1 = sin((double)(((this->rotation).field_0.field_0.y + 3.1415927) - 1.5707964));
  dVar2 = cos((double)(((this->rotation).field_0.field_0.y + 3.1415927) - 1.5707964));
  glm::tvec3<float,(glm::precision)0>::tvec3<double,int,double>
            ((tvec3<float,(glm::precision)0> *)&local_30,dVar1,0,dVar2);
  local_44 = (this->rotation).field_0.field_0.z * 57.29578;
  join_0x00001240_0x00001200_ =
       (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2_0
        )glm::rotateZ<float,(glm::precision)0>
                   ((tvec3<float,_(glm::precision)0> *)&local_30,&local_44);
  local_38 = local_50;
  local_40 = stack0xffffffffffffffa8;
  right.field_0.field_0.x = local_50;
  local_30 = stack0xffffffffffffffa8;
  join_0x00001240_0x00001200_ =
       (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2_0
        )glm::cross<float,(glm::precision)0>
                   ((tvec3<float,_(glm::precision)0> *)&local_30,
                    (tvec3<float,_(glm::precision)0> *)this_00);
  up.field_0.field_0.x = local_70;
  local_68 = (undefined1  [8])pos.field_0._4_8_;
  glm::tvec3<float,_(glm::precision)0>::tvec3
            ((tvec3<float,_(glm::precision)0> *)local_84,(this->position).field_0.field_0.x,
             (this->position).field_0.field_0.y,(this->position).field_0.field_0.z);
  tVar5 = glm::operator+((tvec3<float,_(glm::precision)0> *)local_84,
                         (tvec3<float,_(glm::precision)0> *)this_00);
  local_a0 = tVar5.field_0._0_8_;
  local_90._0_8_ = local_a0;
  local_98 = tVar5.field_0._8_4_;
  local_90.field_0.z = local_98;
  glm::lookAt<float,(glm::precision)0>
            (__return_storage_ptr__,(glm *)local_84,
             (tvec3<float,_(glm::precision)0> *)&local_90.field_0,
             (tvec3<float,_(glm::precision)0> *)local_68,in_R8);
  return __return_storage_ptr__;
}

Assistant:

glm::mat4 Camera::getViewMatrix()
{
	float halfPI = 1.57079632679f;
	glm::vec3 direction = glm::vec3(
		cos(rotation.x) * sin(rotation.y + 3.14159265359f),
		sin(rotation.x),
		cos(rotation.x) * cos(rotation.y + 3.14159265359f)
	);
	
	glm::vec3 right = glm::vec3(
		sin(rotation.y + 3.14159265359f - halfPI),
		0,
		cos(rotation.y + 3.14159265359f - halfPI)
	);
	right = glm::rotateZ(right, rotation.z*57.2957795f );

	glm::vec3 up = glm::cross(right, direction);

	glm::vec3 pos = glm::vec3(position.x, position.y, position.z);

	return glm::lookAt(
		pos,
		pos + direction,
		up
	);
}